

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O1

DdNode * Abc_ConvertSopToBdd(DdManager *dd,char *pSop,DdNode **pbVars)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  DdNode *local_48;
  
  uVar3 = Abc_SopGetVarNum(pSop);
  pDVar5 = Cudd_ReadLogicZero(dd);
  Cudd_Ref(pDVar5);
  iVar4 = Abc_SopIsExorType(pSop);
  if (iVar4 == 0) {
    if (*pSop != '\0') {
      pcVar8 = pSop;
      local_48 = pDVar5;
LAB_0084380f:
      pDVar6 = Cudd_ReadOne(dd);
      Cudd_Ref(pDVar6);
      lVar7 = 0;
      do {
        bVar2 = pcVar8[lVar7];
        if (bVar2 < 0x31) {
          if (bVar2 == 0x30) {
            if (pbVars == (DdNode **)0x0) {
              pDVar5 = Cudd_bddIthVar(dd,(int)lVar7);
            }
            else {
              pDVar5 = pbVars[lVar7];
            }
            pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
LAB_00843876:
            pDVar5 = Cudd_bddAnd(dd,pDVar6,pDVar5);
            Cudd_Ref(pDVar5);
            Cudd_RecursiveDeref(dd,pDVar6);
            pDVar6 = pDVar5;
          }
          else if ((bVar2 == 0) || (bVar2 == 0x20)) goto LAB_0084389f;
        }
        else if (bVar2 == 0x31) {
          if (pbVars == (DdNode **)0x0) {
            pDVar5 = Cudd_bddIthVar(dd,(int)lVar7);
          }
          else {
            pDVar5 = pbVars[lVar7];
          }
          goto LAB_00843876;
        }
        lVar7 = lVar7 + 1;
      } while( true );
    }
  }
  else if (0 < (int)uVar3) {
    uVar9 = 0;
    pDVar6 = pDVar5;
    do {
      if (pbVars == (DdNode **)0x0) {
        pDVar5 = Cudd_bddIthVar(dd,(int)uVar9);
      }
      else {
        pDVar5 = pbVars[uVar9];
      }
      pDVar5 = Cudd_bddXor(dd,pDVar6,pDVar5);
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(dd,pDVar6);
      uVar9 = uVar9 + 1;
      pDVar6 = pDVar5;
    } while (uVar3 != uVar9);
  }
LAB_008438ef:
  iVar4 = Abc_SopGetPhase(pSop);
  pDVar5 = (DdNode *)((ulong)(iVar4 == 0) ^ (ulong)pDVar5);
  Cudd_Deref(pDVar5);
  return pDVar5;
LAB_0084389f:
  pDVar5 = Cudd_bddOr(dd,local_48,pDVar6);
  Cudd_Ref(pDVar5);
  Cudd_RecursiveDeref(dd,local_48);
  Cudd_RecursiveDeref(dd,pDVar6);
  pcVar1 = pcVar8 + (int)(uVar3 + 3);
  pcVar8 = pcVar8 + (int)(uVar3 + 3);
  local_48 = pDVar5;
  if (*pcVar1 == '\0') goto LAB_008438ef;
  goto LAB_0084380f;
}

Assistant:

DdNode * Abc_ConvertSopToBdd( DdManager * dd, char * pSop, DdNode ** pbVars )
{
    DdNode * bSum, * bCube, * bTemp, * bVar;
    char * pCube;
    int nVars, Value, v;

    // start the cover
    nVars = Abc_SopGetVarNum(pSop);
    bSum = Cudd_ReadLogicZero(dd);   Cudd_Ref( bSum );
    if ( Abc_SopIsExorType(pSop) )
    {
        for ( v = 0; v < nVars; v++ )
        {
            bSum  = Cudd_bddXor( dd, bTemp = bSum, pbVars? pbVars[v] : Cudd_bddIthVar(dd, v) );   Cudd_Ref( bSum );
            Cudd_RecursiveDeref( dd, bTemp );
        }
    }
    else
    {
        // check the logic function of the node
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            bCube = Cudd_ReadOne(dd);   Cudd_Ref( bCube );
            Abc_CubeForEachVar( pCube, Value, v )
            {
                if ( Value == '0' )
                    bVar = Cudd_Not( pbVars? pbVars[v] : Cudd_bddIthVar( dd, v ) );
                else if ( Value == '1' )
                    bVar = pbVars? pbVars[v] : Cudd_bddIthVar( dd, v );
                else
                    continue;
                bCube  = Cudd_bddAnd( dd, bTemp = bCube, bVar );   Cudd_Ref( bCube );
                Cudd_RecursiveDeref( dd, bTemp );
            }
            bSum = Cudd_bddOr( dd, bTemp = bSum, bCube );   
            Cudd_Ref( bSum );
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
        }
    }
    // complement the result if necessary
    bSum = Cudd_NotCond( bSum, !Abc_SopGetPhase(pSop) );
    Cudd_Deref( bSum );
    return bSum;
}